

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double eval_guided_crit_weighted<double,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>
                 (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
                 int *Xc_indptr,double *buffer_arr,size_t *buffer_pos,bool as_relative_gain,
                 double *saved_xmedian,double *split_point,double *xmin,double *xmax,
                 GainCriterion criterion,double min_gain,MissingAction missing_action,
                 size_t *cols_use,size_t ncols_use,bool force_cols_use,double *X_row_major,
                 size_t ncols,double *Xr,size_t *Xr_ind,size_t *Xr_indptr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  double dVar1;
  size_t *__first;
  MissingAction MVar2;
  double *pdVar3;
  ulong uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  double *pdVar9;
  long lVar10;
  size_t *psVar11;
  long lVar12;
  size_t row;
  bool bVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar20;
  tuple<> local_81;
  size_t *local_80;
  double local_78;
  ulong local_70;
  ulong local_68;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_60;
  vector<double,_std::allocator<double>_> buffer_w;
  size_t ignored;
  
  MVar2 = missing_action;
  __first = buffer_pos;
  uVar6 = (ulong)missing_action;
  todense<double,int>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,buffer_arr);
  auVar16 = _DAT_0036b1f0;
  local_68 = end - st;
  local_70 = local_68 + 1;
  if (local_70 != 0) {
    uVar4 = local_68 & 0x1fffffffffffffff;
    auVar14._8_4_ = (int)uVar4;
    auVar14._0_8_ = uVar4;
    auVar14._12_4_ = (int)(uVar4 >> 0x20);
    sVar5 = 0;
    auVar14 = auVar14 ^ _DAT_0036b1f0;
    auVar19 = _DAT_0036b1e0;
    do {
      auVar18 = auVar19 ^ auVar16;
      if ((bool)(~(auVar18._4_4_ == auVar14._4_4_ && auVar14._0_4_ < auVar18._0_4_ ||
                  auVar14._4_4_ < auVar18._4_4_) & 1)) {
        __first[sVar5] = sVar5;
      }
      if ((auVar18._12_4_ != auVar14._12_4_ || auVar18._8_4_ <= auVar14._8_4_) &&
          auVar18._12_4_ <= auVar14._12_4_) {
        __first[sVar5 + 1] = sVar5 + 1;
      }
      sVar5 = sVar5 + 2;
      lVar10 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 2;
      auVar19._8_8_ = lVar10 + 2;
    } while ((uVar4 - ((uint)local_68 & 1)) + 2 != sVar5);
  }
  local_78 = (double)end;
  if (MVar2 == Impute) {
    uVar6 = 0;
    bVar13 = local_70 != 0;
    if (bVar13) {
      if ((ulong)ABS(*buffer_arr) < 0x7ff0000000000000) {
        uVar6 = 0;
        do {
          if (local_68 == uVar6) goto LAB_00175c3d;
          lVar10 = uVar6 + 1;
          uVar6 = uVar6 + 1;
        } while ((ulong)ABS(buffer_arr[lVar10]) < 0x7ff0000000000000);
        bVar13 = uVar6 < local_70;
      }
      if (bVar13) {
        uVar6 = local_70 * 4 & 0xfffffffffffffff8;
        lVar10 = 0x3f;
        if (local_70 != 0) {
          for (; local_70 >> lVar10 == 0; lVar10 = lVar10 + -1) {
          }
        }
        local_80 = ix_arr;
        std::
        __introselect<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<eval_guided_crit_weighted<double,int,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,double>(unsigned_long*,unsigned_long,unsigned_long,unsigned_long,double*,int*,int*,double*,unsigned_long*,bool,double*,double&,double&,double&,GainCriterion,double,MissingAction,unsigned_long*,unsigned_long,bool,double*,unsigned_long,double*,unsigned_long*,unsigned_long*,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
                  (__first,(unsigned_long *)((long)__first + uVar6),__first + local_70,
                   (ulong)(((uint)lVar10 ^ 0x3f) * 2) ^ 0x7e,
                   (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_crit_hpp:3503:30)>
                    )&buffer_arr);
        dVar1 = buffer_arr[*(long *)((long)__first + uVar6)];
        *saved_xmedian = dVar1;
        if ((local_68 & 1) != 0) {
          puVar8 = __first;
          if (uVar6 != 8) {
            lVar10 = uVar6 - 8;
            psVar11 = __first;
            puVar7 = __first;
            do {
              puVar7 = puVar7 + 1;
              puVar8 = puVar7;
              if (*puVar7 <= *psVar11) {
                puVar8 = psVar11;
              }
              lVar10 = lVar10 + -8;
              psVar11 = puVar8;
            } while (lVar10 != 0);
          }
          auVar16._0_8_ = (double)CONCAT44(0x43300000,(int)*puVar8);
          auVar16._8_4_ = (int)(*puVar8 >> 0x20);
          auVar16._12_4_ = 0x45300000;
          dVar17 = (auVar16._8_8_ - 1.9342813113834067e+25) + (auVar16._0_8_ - 4503599627370496.0);
          *saved_xmedian = (dVar1 - dVar17) * 0.5 + dVar17;
        }
        lVar10 = local_70 + (local_70 == 0);
        uVar6 = 0;
        pdVar3 = buffer_arr;
        do {
          pdVar9 = saved_xmedian;
          if ((ulong)ABS(*pdVar3) < 0x7ff0000000000000) {
            pdVar9 = pdVar3;
          }
          *pdVar3 = *pdVar9;
          auVar16 = _DAT_0036b1f0;
          pdVar3 = pdVar3 + 1;
          lVar10 = lVar10 + -1;
        } while (lVar10 != 0);
        ix_arr = local_80;
        if (local_70 != 0) {
          uVar4 = local_68 & 0x1fffffffffffffff;
          auVar15._8_4_ = (int)uVar4;
          auVar15._0_8_ = uVar4;
          auVar15._12_4_ = (int)(uVar4 >> 0x20);
          sVar5 = 0;
          auVar15 = auVar15 ^ _DAT_0036b1f0;
          auVar18 = _DAT_0036b1e0;
          do {
            auVar19 = auVar18 ^ auVar16;
            if ((bool)(~(auVar19._4_4_ == auVar15._4_4_ && auVar15._0_4_ < auVar19._0_4_ ||
                        auVar15._4_4_ < auVar19._4_4_) & 1)) {
              __first[sVar5] = sVar5;
            }
            if ((auVar19._12_4_ != auVar15._12_4_ || auVar19._8_4_ <= auVar15._8_4_) &&
                auVar19._12_4_ <= auVar15._12_4_) {
              __first[sVar5 + 1] = sVar5 + 1;
            }
            sVar5 = sVar5 + 2;
            lVar10 = auVar18._8_8_;
            auVar18._0_8_ = auVar18._0_8_ + 2;
            auVar18._8_8_ = lVar10 + 2;
            uVar6 = 0;
          } while ((uVar4 - ((uint)local_68 & 1)) + 2 != sVar5);
        }
      }
      else {
LAB_00175c3d:
        uVar6 = 0;
      }
    }
  }
  local_80 = (size_t *)uVar6;
  std::vector<double,_std::allocator<double>_>::vector
            (&buffer_w,local_70,(allocator_type *)&local_60);
  if (st <= (ulong)local_78) {
    lVar10 = st * 8;
    lVar12 = 0;
    do {
      local_60._M_head_impl = (unsigned_long *)((long)ix_arr + lVar12 + lVar10);
      pVar20 = tsl::detail_robin_hash::
               robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
               ::
               insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                         ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                           *)w,local_60._M_head_impl,
                          (piecewise_construct_t *)&std::piecewise_construct,
                          (tuple<const_unsigned_long_&> *)&local_60,&local_81);
      *(undefined8 *)
       ((long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start + lVar12) =
           *(undefined8 *)((pVar20.first.m_bucket.m_bucket)->m_value + 8);
      st = st + 1;
      lVar12 = lVar12 + 8;
    } while (st <= (ulong)local_78);
  }
  local_78 = eval_guided_crit_weighted<double,std::vector<double,std::allocator<double>>,double>
                       (buffer_pos,0,local_68,buffer_arr,buffer_arr + local_70,as_relative_gain,
                        saved_xmedian,(double *)0x0,&ignored,split_point,xmin,xmax,criterion,
                        min_gain,(MissingAction)local_80,cols_use,ncols_use,force_cols_use,
                        X_row_major,ncols,Xr,Xr_ind,Xr_indptr,&buffer_w);
  if (buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)buffer_w.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_78;
}

Assistant:

double eval_guided_crit_weighted(size_t ix_arr[], size_t st, size_t end,
                                 size_t col_num, real_t_ Xc[], sparse_ix Xc_ind[], sparse_ix Xc_indptr[],
                                 double buffer_arr[], size_t buffer_pos[], bool as_relative_gain,
                                 double *restrict saved_xmedian,
                                 double &restrict split_point, double &restrict xmin, double &restrict xmax,
                                 GainCriterion criterion, double min_gain, MissingAction missing_action,
                                 size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                 double *restrict X_row_major, size_t ncols,
                                 double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                 mapping &restrict w)
{
    size_t ignored;


    todense(ix_arr, st, end,
            col_num, Xc, Xc_ind, Xc_indptr,
            buffer_arr);
    size_t tot = end - st + 1;
    std::iota(buffer_pos, buffer_pos + tot, (size_t)0);


    if (missing_action == Impute)
    {
        missing_action = Fail;
        for (size_t ix = 0; ix < tot; ix++)
        {
            if (unlikely(is_na_or_inf(buffer_arr[ix])))
            {
                goto fill_missing;
            }
        }
        goto no_nas;

        fill_missing:
        {
            size_t idx_half = div2(tot);
            std::nth_element(buffer_pos, buffer_pos + idx_half, buffer_pos + tot,
                             [&buffer_arr](const size_t a, const size_t b){return buffer_arr[a] < buffer_arr[b];});
            *saved_xmedian = buffer_arr[buffer_pos[idx_half]];

            if ((tot % 2) == 0)
            {
                double xlow = *std::max_element(buffer_pos, buffer_pos + idx_half);
                *saved_xmedian = xlow + ((*saved_xmedian)-xlow)/2.;
            }

            for (size_t ix = 0; ix < tot; ix++)
                buffer_arr[ix] = is_na_or_inf(buffer_arr[ix])? (*saved_xmedian) : buffer_arr[ix];
            std::iota(buffer_pos, buffer_pos + tot, (size_t)0);
        }
    }


    no_nas:
    /* TODO: allocate this buffer externally */
    std::vector<double> buffer_w(tot);
    for (size_t row = st; row <= end; row++)
        buffer_w[row-st] = w[ix_arr[row]];
    /* TODO: in this case, as the weights match with the order of the indices, could use a faster version
       with a weighted rel_gain function instead (not yet implemented). */
    return eval_guided_crit_weighted<double, std::vector<double>, ldouble_safe>(
                                     buffer_pos, 0, end - st, buffer_arr, buffer_arr + tot,
                                     as_relative_gain, saved_xmedian, (double*)NULL, ignored, split_point,
                                     xmin, xmax, criterion, min_gain, missing_action,
                                     cols_use, ncols_use, force_cols_use,
                                     X_row_major, ncols,
                                     Xr, Xr_ind, Xr_indptr,
                                     buffer_w);
}